

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

bool __thiscall nonius::detail::option::matches_long(option *this,string *s,string *arg)

{
  reference pcVar1;
  difference_type in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string *in_stack_00000010;
  option *in_stack_00000018;
  const_iterator it;
  bool match;
  tuple<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  tuple<bool_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  *in_stack_ffffffffffffff80;
  bool local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  byte local_21;
  difference_type local_20;
  
  local_20 = in_RDX;
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(&local_30);
  long_separator(in_stack_00000018,in_stack_00000010);
  std::tie<bool,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((bool *)in_RDI,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff80);
  std::tuple<bool&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&>::operator=
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_69 = false;
  if ((local_21 & 1) != 0) {
    std::__cxx11::string::end();
    local_69 = __gnu_cxx::operator!=
                         ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_ffffffffffffff80,
                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_ffffffffffffff78);
  }
  if (local_69 != false) {
    pcVar1 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    if (*pcVar1 != '=') {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+(in_RDI,local_20);
    std::__cxx11::string::end();
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool matches_long(std::string const& s, std::string& arg) const {
                bool match; std::string::const_iterator it;
                std::tie(match, it) = long_separator(s);
                if(match && it != s.end()) {
                    if(*it == '=') arg.assign(it+1, s.end());
                    else return false;
                }
                return match;
            }